

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPSCQueue.h
# Opt level: O0

void __thiscall
rigtorp::SPSCQueue<unsigned_long,_std::allocator<unsigned_long>_>::~SPSCQueue
          (SPSCQueue<unsigned_long,_std::allocator<unsigned_long>_> *this)

{
  unsigned_long *puVar1;
  SPSCQueue<unsigned_long,_std::allocator<unsigned_long>_> *this_local;
  
  while( true ) {
    puVar1 = front(this);
    if (puVar1 == (unsigned_long *)0x0) break;
    pop(this);
  }
  std::allocator_traits<std::allocator<unsigned_long>_>::deallocate
            ((allocator_type *)this,this->slots_,this->capacity_ + 0x10);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)this);
  return;
}

Assistant:

~SPSCQueue() {
    while (front()) {
      pop();
    }
    std::allocator_traits<Allocator>::deallocate(allocator_, slots_,
                                                 capacity_ + 2 * kPadding);
  }